

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O1

CURLcode Curl_altsvc_parse(Curl_easy *data,altsvcinfo *asi,char *value,alpnid srcalpnid,
                          char *srchost,unsigned_short srcport)

{
  curl_trc_feat *pcVar1;
  uint srcport_00;
  _Bool _Var2;
  byte bVar3;
  unsigned_short uVar4;
  int iVar5;
  alpnid dstalpnid;
  size_t sVar6;
  unsigned_long ulnum;
  altsvc *p;
  time_t tVar7;
  byte *pbVar8;
  byte *pbVar9;
  _Bool _Var10;
  char *pcVar11;
  bool bVar12;
  size_t __n;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  byte *pbVar17;
  char alpnbuf [10];
  char *end_ptr;
  char option [32];
  char namebuf [512];
  uint local_2a4;
  undefined8 local_298;
  char local_290 [16];
  ulong local_280;
  byte *local_278;
  altsvcinfo *local_270;
  uint local_264;
  Curl_llist *local_260;
  char local_258 [32];
  char local_238 [520];
  
  local_270 = asi;
  memset(local_238,0,0x200);
  local_290[8] = '\0';
  local_290[9] = '\0';
  local_290[0] = '\0';
  local_290[1] = '\0';
  local_290[2] = '\0';
  local_290[3] = '\0';
  local_290[4] = '\0';
  local_290[5] = '\0';
  local_290[6] = '\0';
  local_290[7] = '\0';
  for (; (*value == '\t' || (*value == ' ')); value = value + 1) {
  }
  local_2a4 = (uint)srcport;
  uVar14 = 0;
  while ((0x3d < (ulong)(byte)value[uVar14] ||
         ((0x2800000100000201U >> ((ulong)(byte)value[uVar14] & 0x3f) & 1) == 0))) {
    uVar14 = uVar14 + 1;
  }
  if (uVar14 < 10 && uVar14 != 0) {
    memcpy(local_290,value,uVar14);
    local_290[uVar14] = '\0';
    iVar5 = curl_strequal(local_290,"clear");
    if (iVar5 == 0) {
      pbVar8 = (byte *)(value + uVar14);
      local_260 = &local_270->list;
      lVar16 = 0;
      local_298 = srchost;
      local_264 = local_2a4;
      while (*pbVar8 == 0x3d) {
        dstalpnid = alpn2alpnid(local_290);
        if (pbVar8[1] == 0x22) {
          pbVar9 = pbVar8 + 2;
          if (pbVar8[2] == 0x3a) {
            bVar13 = true;
            goto LAB_00111089;
          }
          if (pbVar8[2] == 0x5b) {
            sVar6 = strspn((char *)(pbVar8 + 3),"0123456789abcdefABCDEF:.");
            if (pbVar8[sVar6 + 3] == 0x5d) {
              __n = sVar6 + 2;
              pbVar8 = pbVar8 + sVar6 + 4;
              goto LAB_00110fd8;
            }
            bVar13 = true;
            iVar5 = 6;
            bVar12 = false;
            srchost = "";
            pbVar8 = pbVar8 + 3;
          }
          else {
            bVar3 = *pbVar9;
            pbVar8 = pbVar9;
            while ((bVar3 != 0 &&
                   (((byte)(bVar3 + 0x9f) < 0x1a || (byte)(bVar3 - 0x30) < 10 ||
                    ((byte)(bVar3 + 0xbf) < 0x1a || (byte)(bVar3 - 0x2d) < 2))))) {
              pbVar17 = pbVar8 + 1;
              pbVar8 = pbVar8 + 1;
              bVar3 = *pbVar17;
            }
            __n = (long)pbVar8 - (long)pbVar9;
LAB_00110fd8:
            if (__n - 0x200 < 0xfffffffffffffe01) {
              bVar12 = true;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar1->log_level)))) {
                Curl_infof(data,"Excessive alt-svc hostname, ignoring.");
              }
              iVar5 = 0;
              srchost = "";
              bVar13 = false;
            }
            else {
              srchost = local_238;
              memcpy(srchost,pbVar9,__n);
              local_238[__n] = '\0';
              bVar12 = true;
              iVar5 = 0;
              bVar13 = true;
            }
          }
          pbVar9 = pbVar8;
          if (bVar12) {
LAB_00111089:
            pbVar17 = pbVar9;
            if (*pbVar9 == 0x3a) {
              pbVar17 = pbVar9 + 1;
              if ((byte)(pbVar9[1] - 0x30) < 10) {
                ulnum = strtoul((char *)pbVar17,(char **)&local_278,10);
              }
              else {
                ulnum = 0;
                local_278 = pbVar17;
              }
              pbVar8 = local_278;
              if (((ulnum - 0x10000 < 0xffffffffffff0001) || (local_278 == pbVar17)) ||
                 (*local_278 != 0x22)) {
                if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
                   ((pcVar1 = (data->state).feat, pcVar1 != (curl_trc_feat *)0x0 &&
                    (pcVar1->log_level < 1)))) {
                  bVar13 = false;
                }
                else {
                  Curl_infof(data,"Unknown alt-svc port number, ignoring.");
                  bVar13 = false;
                }
              }
              else {
                uVar4 = curlx_ultous(ulnum);
                local_2a4 = (uint)uVar4;
                pbVar17 = pbVar8;
              }
            }
            pbVar8 = pbVar17 + 1;
            iVar5 = 1;
            if (*pbVar17 == 0x22) {
              bVar12 = false;
              uVar14 = 0x15180;
              _Var2 = false;
LAB_00111158:
              _Var10 = _Var2;
              srcport_00 = local_264;
              pbVar9 = pbVar8 + 2;
              while( true ) {
                pbVar17 = pbVar8 + 1;
                bVar3 = *pbVar8;
                if ((bVar3 != 9) && (bVar3 != 0x20)) break;
                pbVar9 = pbVar9 + 1;
                pbVar8 = pbVar17;
              }
              if ((bVar3 == 0x3b) &&
                 ((0xd < *pbVar17 || (pbVar8 = pbVar17, (0x2401U >> (*pbVar17 & 0x1f) & 1) == 0))))
              {
                for (; (*pbVar17 == 9 || (*pbVar17 == 0x20)); pbVar17 = pbVar17 + 1) {
                  pbVar9 = pbVar9 + 1;
                }
                uVar15 = 0;
                while ((0x3d < (ulong)pbVar17[uVar15] ||
                       ((0x2800000100000201U >> ((ulong)pbVar17[uVar15] & 0x3f) & 1) == 0))) {
                  uVar15 = uVar15 + 1;
                  pbVar9 = pbVar9 + 1;
                }
                if (uVar15 < 0x20 && uVar15 != 0) {
                  local_280 = uVar14;
                  memcpy(local_258,pbVar17,uVar15);
                  local_258[uVar15] = '\0';
                }
                else {
                  local_258[0] = '\0';
                  local_280 = uVar14;
                }
                iVar5 = 1;
                for (pbVar8 = pbVar17 + uVar15; (bVar3 = *pbVar8, bVar3 == 9 || (bVar3 == 0x20));
                    pbVar8 = pbVar8 + 1) {
                  pbVar9 = pbVar9 + 1;
                }
                if (bVar3 == 0x3d) {
                  do {
                    pbVar8 = pbVar9;
                    bVar3 = *pbVar8;
                    pbVar9 = pbVar8;
                    if (bVar3 < 0x20) {
                      if (bVar3 != 9) goto LAB_00111259;
                    }
                    else if (bVar3 != 0x20) {
                      if (bVar3 == 0x22) {
                        bVar12 = true;
                        pbVar9 = pbVar8 + 1;
                      }
                      goto LAB_0011126e;
                    }
                    pbVar9 = pbVar8 + 1;
                  } while( true );
                }
                goto LAB_00111378;
              }
              iVar5 = 0;
              if ((dstalpnid == ALPN_none) || (iVar5 = 0, !bVar13)) goto LAB_00111378;
              local_280 = uVar14;
              if (lVar16 == 0) {
                altsvc_flush(local_270,srcalpnid,local_298,(unsigned_short)local_264);
              }
              lVar16 = lVar16 + 1;
              p = altsvc_createid(local_298,srchost,srcalpnid,dstalpnid,srcport_00,local_2a4);
              if (p != (altsvc *)0x0) {
                tVar7 = time((time_t *)0x0);
                p->expires = tVar7 + local_280;
                p->persist = _Var10;
                Curl_llist_append(local_260,p,&p->node);
                if (data != (Curl_easy *)0x0) {
                  iVar5 = 0;
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar1->log_level)))) {
                    pcVar11 = "h1";
                    if (dstalpnid != ALPN_h1) {
                      if (dstalpnid == ALPN_h3) {
                        pcVar11 = "h3";
                      }
                      else if (dstalpnid == ALPN_h2) {
                        pcVar11 = "h2";
                      }
                      else {
                        pcVar11 = "";
                      }
                    }
                    Curl_infof(data,"Added alt-svc: %s:%d over %s",srchost,local_2a4,pcVar11);
                    iVar5 = 0;
                  }
                  goto LAB_00111378;
                }
              }
              iVar5 = 0;
            }
          }
LAB_00111378:
          srchost = local_298;
          if (iVar5 == 0) {
            bVar13 = true;
            if (*pbVar8 == 0x2c) {
              do {
                do {
                  pbVar9 = pbVar8;
                  pbVar17 = pbVar9 + 1;
                  pbVar8 = pbVar17;
                } while (pbVar9[1] == 9);
              } while (pbVar9[1] == 0x20);
              uVar14 = 1;
              while ((0x3d < (ulong)pbVar9[uVar14] ||
                     ((0x2800000100000201U >> ((ulong)pbVar9[uVar14] & 0x3f) & 1) == 0))) {
                uVar14 = uVar14 + 1;
              }
              pbVar8 = pbVar9 + uVar14;
              bVar13 = uVar14 < 0xb && uVar14 != 1;
              if (uVar14 < 0xb && uVar14 != 1) {
                memcpy(local_290,pbVar17,uVar14 - 1);
                *(undefined1 *)((long)&local_298 + uVar14 + 7) = 0;
                srchost = local_298;
              }
            }
          }
          else {
            bVar13 = false;
          }
        }
        else {
          pbVar8 = pbVar8 + 1;
          bVar13 = false;
        }
        if (!bVar13) {
          return CURLE_OK;
        }
        if (((ulong)*pbVar8 < 0x3c) && ((0x800000000002401U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)) {
          return CURLE_OK;
        }
      }
    }
    else {
      altsvc_flush(local_270,srcalpnid,srchost,srcport);
    }
  }
  else if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))
          ) {
    Curl_infof(data,"Excessive alt-svc header, ignoring.");
  }
  return CURLE_OK;
LAB_00111259:
  if (bVar3 == 0) goto LAB_00111378;
LAB_0011126e:
  pbVar8 = pbVar9;
  pbVar17 = pbVar9;
  if (bVar12) {
    do {
      pbVar8 = pbVar17 + 1;
      bVar3 = *pbVar17;
      if (bVar3 == 0) break;
      pbVar17 = pbVar8;
    } while (bVar3 != 0x22);
    if (bVar3 == 0) goto LAB_00111378;
  }
  else {
    while ((0x3b < (ulong)*pbVar8 || ((0x800100100000201U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))) {
      pbVar8 = pbVar8 + 1;
    }
  }
  uVar15 = strtoul((char *)pbVar9,(char **)&local_278,10);
  uVar14 = local_280;
  _Var2 = _Var10;
  if (uVar15 != 0xffffffffffffffff && local_278 != pbVar9) {
    iVar5 = curl_strequal("ma",local_258);
    uVar14 = uVar15;
    if (iVar5 == 0) {
      iVar5 = curl_strequal("persist",local_258);
      if (uVar15 == 1) {
        _Var2 = true;
      }
      uVar14 = local_280;
      if (iVar5 == 0) {
        _Var2 = _Var10;
      }
    }
  }
  goto LAB_00111158;
}

Assistant:

CURLcode Curl_altsvc_parse(struct Curl_easy *data,
                           struct altsvcinfo *asi, const char *value,
                           enum alpnid srcalpnid, const char *srchost,
                           unsigned short srcport)
{
  const char *p = value;
  size_t len;
  char namebuf[MAX_ALTSVC_HOSTLEN] = "";
  char alpnbuf[MAX_ALTSVC_ALPNLEN] = "";
  struct altsvc *as;
  unsigned short dstport = srcport; /* the same by default */
  CURLcode result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
  size_t entries = 0;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif
  if(result) {
    infof(data, "Excessive alt-svc header, ignoring.");
    return CURLE_OK;
  }

  DEBUGASSERT(asi);

  /* "clear" is a magic keyword */
  if(strcasecompare(alpnbuf, "clear")) {
    /* Flush cached alternatives for this source origin */
    altsvc_flush(asi, srcalpnid, srchost, srcport);
    return CURLE_OK;
  }

  do {
    if(*p == '=') {
      /* [protocol]="[host][:port]" */
      enum alpnid dstalpnid = alpn2alpnid(alpnbuf); /* the same by default */
      p++;
      if(*p == '\"') {
        const char *dsthost = "";
        const char *value_ptr;
        char option[32];
        unsigned long num;
        char *end_ptr;
        bool quoted = FALSE;
        time_t maxage = 24 * 3600; /* default is 24 hours */
        bool persist = FALSE;
        bool valid = TRUE;
        p++;
        if(*p != ':') {
          /* hostname starts here */
          const char *hostp = p;
          if(*p == '[') {
            /* pass all valid IPv6 letters - does not handle zone id */
            len = strspn(++p, "0123456789abcdefABCDEF:.");
            if(p[len] != ']')
              /* invalid host syntax, bail out */
              break;
            /* we store the IPv6 numerical address *with* brackets */
            len += 2;
            p = &p[len-1];
          }
          else {
            while(*p && (ISALNUM(*p) || (*p == '.') || (*p == '-')))
              p++;
            len = p - hostp;
          }
          if(!len || (len >= MAX_ALTSVC_HOSTLEN)) {
            infof(data, "Excessive alt-svc hostname, ignoring.");
            valid = FALSE;
          }
          else {
            memcpy(namebuf, hostp, len);
            namebuf[len] = 0;
            dsthost = namebuf;
          }
        }
        else {
          /* no destination name, use source host */
          dsthost = srchost;
        }
        if(*p == ':') {
          unsigned long port = 0;
          p++;
          if(ISDIGIT(*p))
            /* a port number */
            port = strtoul(p, &end_ptr, 10);
          else
            end_ptr = (char *)p; /* not left uninitialized */
          if(!port || port > USHRT_MAX || end_ptr == p || *end_ptr != '\"') {
            infof(data, "Unknown alt-svc port number, ignoring.");
            valid = FALSE;
          }
          else {
            dstport = curlx_ultous(port);
            p = end_ptr;
          }
        }
        if(*p++ != '\"')
          break;
        /* Handle the optional 'ma' and 'persist' flags. Unknown flags
           are skipped. */
        for(;;) {
          while(ISBLANK(*p))
            p++;
          if(*p != ';')
            break;
          p++; /* pass the semicolon */
          if(!*p || ISNEWLINE(*p))
            break;
          result = getalnum(&p, option, sizeof(option));
          if(result) {
            /* skip option if name is too long */
            option[0] = '\0';
          }
          while(*p && ISBLANK(*p))
            p++;
          if(*p != '=')
            return CURLE_OK;
          p++;
          while(*p && ISBLANK(*p))
            p++;
          if(!*p)
            return CURLE_OK;
          if(*p == '\"') {
            /* quoted value */
            p++;
            quoted = TRUE;
          }
          value_ptr = p;
          if(quoted) {
            while(*p && *p != '\"')
              p++;
            if(!*p++)
              return CURLE_OK;
          }
          else {
            while(*p && !ISBLANK(*p) && *p!= ';' && *p != ',')
              p++;
          }
          num = strtoul(value_ptr, &end_ptr, 10);
          if((end_ptr != value_ptr) && (num < ULONG_MAX)) {
            if(strcasecompare("ma", option))
              maxage = (time_t)num;
            else if(strcasecompare("persist", option) && (num == 1))
              persist = TRUE;
          }
        }
        if(dstalpnid && valid) {
          if(!entries++)
            /* Flush cached alternatives for this source origin, if any - when
               this is the first entry of the line. */
            altsvc_flush(asi, srcalpnid, srchost, srcport);

          as = altsvc_createid(srchost, dsthost,
                               srcalpnid, dstalpnid,
                               srcport, dstport);
          if(as) {
            /* The expires time also needs to take the Age: value (if any) into
               account. [See RFC 7838 section 3.1] */
            as->expires = maxage + time(NULL);
            as->persist = persist;
            Curl_llist_append(&asi->list, as, &as->node);
            infof(data, "Added alt-svc: %s:%d over %s", dsthost, dstport,
                  Curl_alpnid2str(dstalpnid));
          }
        }
      }
      else
        break;
      /* after the double quote there can be a comma if there is another
         string or a semicolon if no more */
      if(*p == ',') {
        /* comma means another alternative is presented */
        p++;
        result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
        if(result)
          break;
      }
    }
    else
      break;
  } while(*p && (*p != ';') && (*p != '\n') && (*p != '\r'));

  return CURLE_OK;
}